

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O1

void __thiscall
QGridLayoutPrivate::distribute(QGridLayoutPrivate *this,QRect r,int hSpacing,int vSpacing)

{
  QGridBox *pQVar1;
  QLayoutStruct *pQVar2;
  QLayoutStruct *pQVar3;
  LayoutDirection LVar4;
  QWidget *this_00;
  int pos;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int pos_00;
  int iVar10;
  int iVar11;
  QList<QLayoutStruct> *chain;
  int iVar12;
  long in_FS_OFFSET;
  uint local_48;
  uint local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = this->field_0x194;
  this_00 = QLayout::parentWidget(*(QLayout **)&(this->super_QLayoutPrivate).field_0x8);
  if (this_00 != (QWidget *)0x0) {
    LVar4 = QWidget::layoutDirection(this_00);
    bVar5 = bVar5 ^ LVar4 == RightToLeft;
  }
  setupLayoutData(this,hSpacing,vSpacing);
  pos = this->leftMargin + r.x1.m_i.m_i;
  pos_00 = r.y1.m_i.m_i + this->topMargin;
  iVar10 = r.x2.m_i.m_i - this->rightMargin;
  iVar12 = r.y2.m_i.m_i - this->bottomMargin;
  iVar7 = (iVar10 - pos) + 1;
  qGeomCalc(&this->colData,0,this->cc,pos,iVar7,-1);
  if ((this->field_0x194 & 8) == 0) {
    chain = &this->rowData;
    qGeomCalc(chain,0,this->rr,pos_00,(iVar12 - pos_00) + 1,-1);
  }
  else {
    recalcHFW(this,iVar7);
    qGeomCalc(this->hfwData,0,this->rr,pos_00,(iVar12 - pos_00) + 1,-1);
    chain = this->hfwData;
  }
  iVar7 = (this->super_QLayoutPrivate).rect.y2.m_i;
  bVar6 = 1;
  if (iVar12 <= iVar7) {
    if (iVar12 == iVar7) {
      bVar6 = (this->super_QLayoutPrivate).rect.x2.m_i < iVar10 ^ bVar5;
    }
    else {
      bVar6 = 0;
    }
  }
  iVar7 = (int)(this->things).d.size;
  if (0 < iVar7) {
    iVar11 = 0;
    do {
      iVar7 = iVar7 + -1;
      iVar9 = iVar11;
      if ((bVar6 & 1) != 0) {
        iVar9 = iVar7;
      }
      pQVar1 = (this->things).d.ptr[iVar9];
      iVar9 = this->rr + -1;
      if (-1 < pQVar1->torow) {
        iVar9 = pQVar1->torow;
      }
      iVar8 = this->cc + -1;
      if (-1 < pQVar1->tocol) {
        iVar8 = pQVar1->tocol;
      }
      pQVar2 = (this->colData).d.ptr;
      iVar8 = pQVar2[iVar8].size + pQVar2[iVar8].pos;
      pQVar3 = (chain->d).ptr;
      iVar9 = pQVar3[iVar9].size + pQVar3[iVar9].pos;
      local_48 = (pos + iVar10 + 1) - iVar8;
      if ((bVar5 & 1) == 0) {
        local_48 = pQVar2[pQVar1->col].pos;
      }
      local_44 = (pos_00 + iVar12 + 1) - iVar9;
      if ((this->field_0x194 & 2) == 0) {
        local_44 = pQVar3[pQVar1->row].pos;
      }
      local_40 = ~pQVar2[pQVar1->col].pos + iVar8 + local_48;
      local_3c = ~pQVar3[pQVar1->row].pos + iVar9 + local_44;
      (*pQVar1->item_->_vptr_QLayoutItem[6])(pQVar1->item_,&local_48);
      iVar11 = iVar11 + 1;
    } while (iVar7 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGridLayoutPrivate::distribute(QRect r, int hSpacing, int vSpacing)
{
    Q_Q(QGridLayout);
    bool visualHReversed = hReversed;
    QWidget *parent = q->parentWidget();
    if (parent && parent->isRightToLeft())
        visualHReversed = !visualHReversed;

    setupLayoutData(hSpacing, vSpacing);

    int left, top, right, bottom;
    effectiveMargins(&left, &top, &right, &bottom);
    r.adjust(+left, +top, -right, -bottom);

    qGeomCalc(colData, 0, cc, r.x(), r.width());
    QList<QLayoutStruct> *rDataPtr;
    if (has_hfw) {
        recalcHFW(r.width());
        qGeomCalc(*hfwData, 0, rr, r.y(), r.height());
        rDataPtr = hfwData;
    } else {
        qGeomCalc(rowData, 0, rr, r.y(), r.height());
        rDataPtr = &rowData;
    }
    QList<QLayoutStruct> &rData = *rDataPtr;
    int i;

    bool reverse = ((r.bottom() > rect.bottom()) || (r.bottom() == rect.bottom()
                                                     && ((r.right() > rect.right()) != visualHReversed)));
    int n = things.size();
    for (i = 0; i < n; ++i) {
        QGridBox *box = things.at(reverse ? n-i-1 : i);
        int r2 = box->toRow(rr);
        int c2 = box->toCol(cc);

        int x = colData.at(box->col).pos;
        int y = rData.at(box->row).pos;
        int x2p = colData.at(c2).pos + colData.at(c2).size; // x2+1
        int y2p = rData.at(r2).pos + rData.at(r2).size;    // y2+1
        int w = x2p - x;
        int h = y2p - y;

        if (visualHReversed)
            x = r.left() + r.right() - x - w + 1;
        if (vReversed)
            y = r.top() + r.bottom() - y - h + 1;

        box->setGeometry(QRect(x, y, w, h));
    }
}